

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  long lVar1;
  long lVar2;
  SQInteger SVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  SQFuncState *funcstate;
  sqvector<SQInstruction> *this_00;
  SQCompiler *pSVar6;
  long lVar7;
  SQObjectValue SVar8;
  long *in_RDI;
  SQObject SVar9;
  SQInteger oldouters;
  SQInteger i_1;
  SQInteger continuetrg;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQInteger i;
  SQInstructionVec exp;
  SQInteger expsize;
  SQInteger expend;
  SQInteger expstart;
  SQInteger jzpos;
  SQInteger jmppos;
  SQScope __oldscope__;
  SQInstruction *in_stack_fffffffffffffe88;
  SQCompiler *in_stack_fffffffffffffe90;
  SQInteger in_stack_fffffffffffffe98;
  SQFuncState *in_stack_fffffffffffffea0;
  SQFuncState *in_stack_fffffffffffffea8;
  SQCompiler *in_stack_fffffffffffffeb0;
  SQInstruction *in_stack_fffffffffffffeb8;
  SQOpcode _op;
  SQFuncState *in_stack_fffffffffffffec0;
  SQFuncState *this_01;
  long in_stack_fffffffffffffed8;
  SQFuncState *in_stack_fffffffffffffee0;
  SQCompiler *in_stack_fffffffffffffef0;
  SQUnsignedInteger local_e0;
  SQInteger in_stack_ffffffffffffff30;
  SQCompiler *in_stack_ffffffffffffff38;
  long local_a0;
  sqvector<SQInstruction> local_98;
  long local_80;
  SQInteger local_78;
  SQObjectType local_70;
  undefined1 closeframe;
  SQCompiler *local_48;
  
  Lex(in_stack_fffffffffffffe90);
  lVar1 = in_RDI[0x1d];
  lVar2 = in_RDI[0x1e];
  in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
  SVar3 = SQFuncState::GetStackSize((SQFuncState *)0x118fe5);
  in_RDI[0x1e] = SVar3;
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if (*in_RDI == 0x11b) {
    LocalDeclStatement(in_stack_fffffffffffffef0);
  }
  else if (*in_RDI != 0x3b) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
  }
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  SQFuncState::GetCurrentPos((SQFuncState *)0x1190a2);
  local_48 = (SQCompiler *)0xffffffffffffffff;
  if (*in_RDI != 0x3b) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
    SQFuncState::AddInstruction
              (in_stack_fffffffffffffec0,(SQOpcode)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
               (SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8,
               (SQInteger)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    local_48 = (SQCompiler *)SQFuncState::GetCurrentPos((SQFuncState *)0x119122);
  }
  Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  SVar3 = SQFuncState::GetCurrentPos((SQFuncState *)0x11916f);
  pSVar6 = (SQCompiler *)(SVar3 + 1);
  if (*in_RDI != 0x29) {
    CommaExpr(in_stack_fffffffffffffe90);
    SQFuncState::PopTarget(in_stack_fffffffffffffea0);
  }
  SVar9 = Expect(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  SVar8 = SVar9._unVal;
  local_70 = SVar9._type;
  SQFuncState::SnoozeOpt((SQFuncState *)in_RDI[1]);
  local_78 = SQFuncState::GetCurrentPos((SQFuncState *)0x1191ef);
  local_80 = (local_78 - (long)pSVar6) + 1;
  sqvector<SQInstruction>::sqvector(&local_98);
  closeframe = (undefined1)((ulong)SVar8 >> 0x38);
  if (0 < local_80) {
    for (local_a0 = 0; closeframe = (undefined1)((ulong)SVar8 >> 0x38), local_a0 < local_80;
        local_a0 = local_a0 + 1) {
      SQFuncState::GetInstruction
                ((SQFuncState *)in_stack_fffffffffffffe90,(SQInteger)in_stack_fffffffffffffe88);
      sqvector<SQInstruction>::push_back
                ((sqvector<SQInstruction> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    SQFuncState::PopInstructions(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  SVar5 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88)
  ;
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_fffffffffffffe90,(longlong *)in_stack_fffffffffffffe88)
  ;
  Statement(pSVar6,(bool)closeframe);
  SQFuncState::GetCurrentPos((SQFuncState *)0x1193ba);
  if (0 < local_80) {
    for (local_e0 = 0; (long)local_e0 < local_80; local_e0 = local_e0 + 1) {
      in_stack_fffffffffffffed8 = in_RDI[1];
      in_stack_fffffffffffffee0 =
           (SQFuncState *)sqvector<SQInstruction>::operator[](&local_98,local_e0);
      SQFuncState::AddInstruction(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
  }
  _op = (SQOpcode)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  this_01 = (SQFuncState *)in_RDI[1];
  SQFuncState::GetCurrentPos((SQFuncState *)0x119472);
  SQFuncState::AddInstruction
            (this_01,_op,(SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8,
             (SQInteger)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (0 < (long)local_48) {
    in_stack_fffffffffffffea8 = (SQFuncState *)in_RDI[1];
    SVar3 = SQFuncState::GetCurrentPos((SQFuncState *)0x1194d3);
    SQFuncState::SetInstructionParam
              (this_01,SVar3,(SQInteger)local_48,(SQInteger)in_stack_fffffffffffffea8);
    _op = (SQOpcode)((ulong)SVar3 >> 0x20);
    in_stack_fffffffffffffeb0 = local_48;
  }
  pSVar6 = (SQCompiler *)sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  lVar7 = (long)pSVar6 - SVar4;
  funcstate = (SQFuncState *)sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  if (0 < (long)((long)funcstate - SVar5)) {
    ResolveContinues(pSVar6,funcstate,(SQInteger)in_stack_fffffffffffffe90,
                     (SQInteger)in_stack_fffffffffffffe88);
  }
  if (0 < lVar7) {
    ResolveBreaks(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(SQInteger)pSVar6);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x170));
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x188));
  lVar7 = *(long *)(in_RDI[1] + 0x1c8);
  this_00 = (sqvector<SQInstruction> *)SQFuncState::GetStackSize((SQFuncState *)0x119613);
  if ((this_00 != (sqvector<SQInstruction> *)in_RDI[0x1e]) &&
     (SQFuncState::SetStackSize(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8),
     lVar7 != *(long *)(in_RDI[1] + 0x1c8))) {
    SQFuncState::AddInstruction
              (this_01,_op,(SQInteger)in_stack_fffffffffffffeb0,(SQInteger)in_stack_fffffffffffffea8
               ,(SQInteger)pSVar6,(SQInteger)funcstate);
  }
  in_RDI[0x1d] = lVar1;
  in_RDI[0x1e] = lVar2;
  sqvector<SQInstruction>::~sqvector(this_00);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        
        END_BREAKBLE_BLOCK(continuetrg);

		END_SCOPE();
    }